

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__9,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Nonnull<char_*> pcVar1;
  size_t in_R9;
  string_view format;
  char local_78 [32];
  long local_58;
  Nonnull<char_*> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(**(long **)this + 4),local_78);
  local_58 = (long)pcVar1 - (long)local_78;
  local_48 = **(undefined8 **)(this + 8);
  uStack_40 = (*(undefined8 **)(this + 8))[1];
  local_38 = (ulong)**(ushort **)(**(long **)(this + 0x10) + 8);
  local_20 = **(undefined8 **)(this + 0x18);
  local_28 = (*(undefined8 **)(this + 0x18))[1];
  local_30 = ~local_38 + (long)*(ushort **)(**(long **)(this + 0x10) + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_58;
  format._M_len = (size_t)"Field number $0 has already been used in \"$1\" by field \"$2\". $3.";
  local_50 = local_78;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x40,format,
             (Nullable<const_absl::string_view_*>)0x4,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}